

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O0

MPP_RET allocator_ion_free(void *ctx,MppBufferInfo *data)

{
  allocator_ctx_ion *p;
  MppBufferInfo *data_local;
  void *ctx_local;
  
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_ion","do not accept NULL input\n","allocator_ion_free");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((ion_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_ion","enter: ctx %p fd %d ptr %p size %d\n","allocator_ion_free",ctx,
                 (ulong)(uint)data->fd,data->ptr,data->size,0);
    }
    if (data->ptr != (void *)0x0) {
      munmap(data->ptr,data->size);
      data->ptr = (void *)0x0;
    }
    if (0 < data->fd) {
      close(data->fd);
      data->fd = -1;
    }
    if (data->hnd != (void *)0x0) {
      ion_free(*(int *)((long)ctx + 8),(ion_user_handle_t)data->hnd);
      data->hnd = (void *)0x0;
    }
    if ((ion_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_ion","leave\n","allocator_ion_free");
    }
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET allocator_ion_free(void *ctx, MppBufferInfo *data)
{
    allocator_ctx_ion *p = NULL;
    if (NULL == ctx) {
        mpp_err_f("do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    ion_dbg_func("enter: ctx %p fd %d ptr %p size %d\n",
                 ctx, data->fd, data->ptr, data->size);

    p = (allocator_ctx_ion *)ctx;
    if (data->ptr) {
        munmap(data->ptr, data->size);
        data->ptr = NULL;
    }

    if (data->fd > 0) {
        close(data->fd);
        data->fd = -1;
    }

    if (data->hnd) {
        ion_free(p->ion_device, (ion_user_handle_t)((intptr_t)data->hnd));
        data->hnd = NULL;
    }

    ion_dbg_func("leave\n");
    return MPP_OK;
}